

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O2

void my_numbox_size(t_my_numbox *x,t_symbol *s,int ac,t_atom *av)

{
  int iVar1;
  t_float tVar2;
  
  tVar2 = atom_getfloatarg(0,ac,av);
  iVar1 = 1;
  if (1 < (int)tVar2) {
    iVar1 = (int)tVar2;
  }
  x->x_numwidth = iVar1;
  if (1 < ac) {
    tVar2 = atom_getfloatarg(1,ac,av);
    iVar1 = 8;
    if (8 < (int)tVar2) {
      iVar1 = (int)tVar2;
    }
    (x->x_gui).x_h = iVar1 * ((x->x_gui).x_glist)->gl_zoom;
  }
  my_numbox_calc_fontwidth(x);
  iemgui_size(x,&x->x_gui);
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  return;
}

Assistant:

static void my_numbox_size(t_my_numbox *x, t_symbol *s, int ac, t_atom *av)
{
    int h, w;

    w = (int)atom_getfloatarg(0, ac, av);
    if(w < MINDIGITS)
        w = MINDIGITS;
    x->x_numwidth = w;
    if(ac > 1)
    {
        h = (int)atom_getfloatarg(1, ac, av);
        if(h < IEM_GUI_MINSIZE)
            h = IEM_GUI_MINSIZE;
        x->x_gui.x_h = h * IEMGUI_ZOOM(x);
    }
    my_numbox_calc_fontwidth(x);
    iemgui_size((void *)x, &x->x_gui);
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
}